

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void display_options(nh_bool change_birth_opt)

{
  wchar_t wVar1;
  nh_option_desc *options;
  nh_option_desc *pnVar2;
  nh_menuitem_conflict *pnVar3;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  wchar_t n;
  nh_option_desc *birthoptions;
  nh_option_desc *nhoptions;
  wchar_t size;
  wchar_t icount;
  nh_menuitem *items;
  nh_bool change_birth_opt_local;
  
  items._7_1_ = change_birth_opt;
  options = (nh_option_desc *)nh_get_options(2);
  nhoptions._0_4_ = 10;
  _size = (nh_menuitem_conflict *)malloc(0xa78);
  do {
    nhoptions._4_4_ = 0;
    if (items._7_1_ == '\0') {
      pnVar2 = (nh_option_desc *)nh_get_options(1);
      if ((int)nhoptions <= nhoptions._4_4_) {
        nhoptions._0_4_ = (int)nhoptions << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)nhoptions * 0x10c);
      }
      pnVar3 = _size + nhoptions._4_4_;
      pnVar3->id = L'\0';
      pnVar3->role = MI_HEADING;
      pnVar3->accel = '\0';
      pnVar3->group_accel = '\0';
      pnVar3->selected = '\0';
      strcpy(pnVar3->caption,"Game options:");
      nhoptions._4_4_ = nhoptions._4_4_ + 1;
      menu_add_options((nh_menuitem **)&size,(int *)&nhoptions,(int *)((long)&nhoptions + 4),L'\x03'
                       ,options,'\0');
      if ((int)nhoptions <= nhoptions._4_4_) {
        nhoptions._0_4_ = (int)nhoptions << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)nhoptions * 0x10c);
      }
      pnVar3 = _size + nhoptions._4_4_;
      pnVar3->id = L'\0';
      pnVar3->role = MI_HEADING;
      pnVar3->accel = '\0';
      pnVar3->group_accel = '\0';
      pnVar3->selected = '\0';
      strcpy(pnVar3->caption,"Birth options for this game:");
      nhoptions._4_4_ = nhoptions._4_4_ + 1;
      menu_add_options((nh_menuitem **)&size,(int *)&nhoptions,(int *)((long)&nhoptions + 4),L'\x01'
                       ,pnVar2,'\x01');
    }
    else {
      pnVar2 = (nh_option_desc *)nh_get_options(0);
      if ((int)nhoptions <= nhoptions._4_4_) {
        nhoptions._0_4_ = (int)nhoptions << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)nhoptions * 0x10c);
      }
      pnVar3 = _size + nhoptions._4_4_;
      pnVar3->id = L'\0';
      pnVar3->role = MI_HEADING;
      pnVar3->accel = '\0';
      pnVar3->group_accel = '\0';
      pnVar3->selected = '\0';
      strcpy(pnVar3->caption,"Birth options:");
      nhoptions._4_4_ = nhoptions._4_4_ + 1;
      menu_add_options((nh_menuitem **)&size,(int *)&nhoptions,(int *)((long)&nhoptions + 4),L'\x02'
                       ,pnVar2,'\0');
      if ((int)nhoptions <= nhoptions._4_4_) {
        nhoptions._0_4_ = (int)nhoptions << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)nhoptions * 0x10c);
      }
      pnVar3 = _size + nhoptions._4_4_;
      pnVar3->id = L'\0';
      pnVar3->role = MI_HEADING;
      pnVar3->accel = '\0';
      pnVar3->group_accel = '\0';
      pnVar3->selected = '\0';
      strcpy(pnVar3->caption,"Game options:");
      nhoptions._4_4_ = nhoptions._4_4_ + 1;
      menu_add_options((nh_menuitem **)&size,(int *)&nhoptions,(int *)((long)&nhoptions + 4),L'\x03'
                       ,options,'\0');
    }
    if ((int)nhoptions <= nhoptions._4_4_) {
      nhoptions._0_4_ = (int)nhoptions << 1;
      _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)nhoptions * 0x10c);
    }
    pnVar3 = _size + nhoptions._4_4_;
    pnVar3->id = L'\0';
    pnVar3->role = MI_HEADING;
    pnVar3->accel = '\0';
    pnVar3->group_accel = '\0';
    pnVar3->selected = '\0';
    strcpy(pnVar3->caption,"Interface options:");
    nhoptions._4_4_ = nhoptions._4_4_ + L'\x01';
    menu_add_options((nh_menuitem **)&size,(int *)&nhoptions,(int *)((long)&nhoptions + 4),L'\x04',
                     curses_options,'\0');
    wVar1 = curses_display_menu_core
                      (_size,nhoptions._4_4_,"Set what options?",L'\x01',(wchar_t *)0x0,L'\0',L'\0',
                       L'\xffffffff',L'\xffffffff',get_option_value,'\0');
  } while (L'\0' < wVar1);
  free(_size);
  write_config();
  return;
}

Assistant:

void display_options(nh_bool change_birth_opt)
{
    struct nh_menuitem *items;
    int icount, size;
    struct nh_option_desc *nhoptions = nh_get_options(GAME_OPTIONS);
    struct nh_option_desc *birthoptions = NULL;
    int n;
    
    size = 10;
    items = malloc(sizeof(struct nh_menuitem) * size);
    
    do {
	icount = 0;
	if (!change_birth_opt) {
	    birthoptions = nh_get_options(ACTIVE_BIRTH_OPTIONS);
	    /* add general game options */
	    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, GAME_OPTS, nhoptions,
				FALSE);
	    
	    /* add or display birth options */
	    add_menu_txt(items, size, icount, "Birth options for this game:",
			    MI_HEADING);
	    menu_add_options(&items, &size, &icount, ACT_BIRTH_OPTS,
				birthoptions, TRUE);
	} else {
	    birthoptions = nh_get_options(CURRENT_BIRTH_OPTIONS);
	    /* add or display birth options */
	    add_menu_txt(items, size, icount, "Birth options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, CUR_BIRTH_OPTS,
				birthoptions, FALSE);
	    
	    add_menu_txt(items, size, icount, "Game options:", MI_HEADING);
	    menu_add_options(&items, &size, &icount, GAME_OPTS, nhoptions, FALSE);
	}
	
	/* add UI specific options */
	add_menu_txt(items, size, icount, "Interface options:", MI_HEADING);
	menu_add_options(&items, &size, &icount, UI_OPTS, curses_options, FALSE);
	
	n = curses_display_menu_core(items, icount, "Set what options?", PICK_ONE,
				     NULL, 0, 0, -1, -1, get_option_value, FALSE);
    } while (n > 0);
    free(items);
    
    write_config();
}